

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O1

int xmlSerializeDecCharRef(char *buf,int val)

{
  uint uVar1;
  long lVar2;
  
  buf[0] = '&';
  buf[1] = '#';
  if (val < 100) {
    uVar1 = (9 < val) + 1;
  }
  else if (val < 10000) {
    uVar1 = (999 < val) + 3;
  }
  else {
    uVar1 = 7;
    if (val < 1000000) {
      uVar1 = (99999 < val) + 5;
    }
  }
  lVar2 = (ulong)uVar1 + 1;
  do {
    buf[lVar2] = (char)val + (char)(val / 10) * -10 + '0';
    lVar2 = lVar2 + -1;
    val = val / 10;
  } while (1 < lVar2);
  buf[(ulong)uVar1 + 2] = ';';
  return uVar1 + 3;
}

Assistant:

int
xmlSerializeDecCharRef(char *buf, int val) {
    char *out = buf;
    int len, i;

    *out++ = '&';
    *out++ = '#';

    if (val < 100) {
        len = (val < 10) ? 1 : 2;
    } else if (val < 10000) {
        len = (val < 1000) ? 3 : 4;
    } else if (val < 1000000) {
        len = (val < 100000) ? 5 : 6;
    } else {
        len = 7;
    }

    for (i = len - 1; i >= 0; i--) {
        out[i] = '0' + val % 10;
        val /= 10;
    }

    out[len] = ';';

    return(len + 3);
}